

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O3

bool __thiscall cmFindCommon::ComputeIfDebugModeWanted(cmFindCommon *this)

{
  cmMakefile *this_00;
  bool bVar1;
  cmake *pcVar2;
  undefined1 uVar3;
  string local_48;
  
  bVar1 = cmMakefile::GetDebugFindPkgMode(this->Makefile);
  uVar3 = 1;
  if (!bVar1) {
    this_00 = this->Makefile;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_FIND_DEBUG_MODE","");
    bVar1 = cmMakefile::IsOn(this_00,&local_48);
    uVar3 = 1;
    if (!bVar1) {
      pcVar2 = cmMakefile::GetCMakeInstance(this->Makefile);
      uVar3 = pcVar2->DebugFindOutput;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool cmFindCommon::ComputeIfDebugModeWanted()
{
  return this->Makefile->GetDebugFindPkgMode() ||
    this->Makefile->IsOn("CMAKE_FIND_DEBUG_MODE") ||
    this->Makefile->GetCMakeInstance()->GetDebugFindOutput();
}